

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::emplace_back<int&>
          (rcu_list<int,std::mutex,std::allocator<int>> *this,int *vs)

{
  __pointer_type __p;
  pointer pnVar1;
  int *in_RCX;
  node *oldTail;
  undefined1 local_30 [8];
  unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  newNode;
  lock_guard<std::mutex> guard;
  int *vs_local;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &newNode._M_t.
              super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
              .
              super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
             ,(mutex_type *)(this + 0x18));
  detail::
  allocate_unique<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>,int&>
            ((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
              *)local_30,(detail *)(this + 0x40),
             (allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *)
             vs,in_RCX);
  __p = std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::load
                  ((atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>
                    *)(this + 8),memory_order_relaxed);
  if (__p == (__pointer_type)0x0) {
    pnVar1 = std::
             unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
             ::get((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                    *)local_30);
    std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
              ((atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*> *)
               this,pnVar1,memory_order_seq_cst);
    pnVar1 = std::
             unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
             ::release((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                        *)local_30);
    std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
              ((atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*> *)
               (this + 8),pnVar1,memory_order_seq_cst);
  }
  else {
    pnVar1 = std::
             unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
             ::operator->((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                           *)local_30);
    std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
              (&pnVar1->back,__p,memory_order_seq_cst);
    pnVar1 = std::
             unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
             ::get((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                    *)local_30);
    std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
              (&__p->next,pnVar1,memory_order_seq_cst);
    pnVar1 = std::
             unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
             ::release((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                        *)local_30);
    std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
              ((atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*> *)
               (this + 8),pnVar1,memory_order_seq_cst);
  }
  std::
  unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  ::~unique_ptr((unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
                 *)local_30);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &newNode._M_t.
              super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
              .
              super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
            );
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::emplace_back(Us&&... vs)
{
    std::lock_guard<M> guard(m_write_mutex);
    auto newNode =
        detail::allocate_unique<node>(m_node_alloc, std::forward<Us>(vs)...);

    node* oldTail = m_tail.load(std::memory_order_relaxed);

    if (oldTail == nullptr) {
        m_head.store(newNode.get());
        m_tail.store(newNode.release());
    } else {
        newNode->back.store(oldTail);
        oldTail->next.store(newNode.get());
        m_tail.store(newNode.release());
    }
}